

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-slicer-crit.cpp
# Opt level: O2

bool mayBeTheVar(Value *val,string *var)

{
  StringRef RHS;
  bool bVar1;
  iterator iVar2;
  StringRef LHS;
  Value *local_10;
  
  local_10 = val;
  if ((val != (Value *)0x0) && (val[0x10] == (Value)0x3)) {
    LHS = (StringRef)llvm::Value::getName();
    RHS.Data = (var->_M_dataplus)._M_p;
    RHS.Length = var->_M_string_length;
    bVar1 = llvm::operator==(LHS,RHS);
    return bVar1;
  }
  iVar2 = std::
          _Rb_tree<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<const_llvm::Value_*>,_std::allocator<std::pair<const_llvm::Value_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&valuesToVariables_abi_cxx11_._M_t,&local_10);
  if (((_Rb_tree_header *)iVar2._M_node !=
       &valuesToVariables_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) &&
     (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &iVar2._M_node[1]._M_parent,var), bVar1)) {
    return false;
  }
  return true;
}

Assistant:

static inline bool mayBeTheVar(const llvm::Value *val, const std::string &var) {
    // global variables have names, just compare it
    if (auto *G = llvm::dyn_cast<llvm::GlobalVariable>(val)) {
        return G->getName() == var;
    }

    // for other cases, we must relay on the information about allocas
    auto name = valuesToVariables.find(val);
    if (name != valuesToVariables.end() && name->second != var) {
        return false;
    }

    // either the var matches or we do not know the var,
    // which we must take as a match
    return true;
}